

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

SignLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_sign(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x2a8) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x2a8;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    SignLayerParams::SignLayerParams(this_00.sign_);
    (this->layer_).sign_ = (SignLayerParams *)this_00;
  }
  return (SignLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::SignLayerParams* NeuralNetworkLayer::mutable_sign() {
  if (!has_sign()) {
    clear_layer();
    set_has_sign();
    layer_.sign_ = new ::CoreML::Specification::SignLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.sign)
  return layer_.sign_;
}